

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPIDecoder * NewDecoder(WebPDecBuffer *output_buffer,WebPBitstreamFeatures *features)

{
  int iVar1;
  uint64_t in_RSI;
  WebPDecBuffer *in_RDI;
  WebPIDecoder *idec;
  WebPBitstreamFeatures *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  WebPIDecoder *local_8;
  
  local_8 = (WebPIDecoder *)WebPSafeCalloc(in_RSI,in_stack_ffffffffffffffe0);
  if (local_8 == (WebPIDecoder *)0x0) {
    local_8 = (WebPIDecoder *)0x0;
  }
  else {
    local_8->state_ = STATE_WEBP_HEADER;
    local_8->chunk_size_ = 0;
    local_8->last_mb_y_ = -1;
    InitMemBuffer(&local_8->mem_);
    WebPInitDecBuffer((WebPDecBuffer *)0x10e864);
    VP8InitIo((VP8Io *)0x10e875);
    WebPResetDecParams((WebPDecParams *)0x10e883);
    if ((in_RDI == (WebPDecBuffer *)0x0) ||
       (iVar1 = WebPAvoidSlowMemory((WebPDecBuffer *)local_8,in_stack_ffffffffffffffd8), iVar1 != 0)
       ) {
      (local_8->params_).output = &local_8->output_;
      local_8->final_output_ = in_RDI;
      if (in_RDI != (WebPDecBuffer *)0x0) {
        ((local_8->params_).output)->colorspace = in_RDI->colorspace;
      }
    }
    else {
      (local_8->params_).output = in_RDI;
      local_8->final_output_ = (WebPDecBuffer *)0x0;
    }
    WebPInitCustomIo(&local_8->params_,&local_8->io_);
  }
  return local_8;
}

Assistant:

static WebPIDecoder* NewDecoder(WebPDecBuffer* const output_buffer,
                                const WebPBitstreamFeatures* const features) {
  WebPIDecoder* idec = (WebPIDecoder*)WebPSafeCalloc(1ULL, sizeof(*idec));
  if (idec == NULL) {
    return NULL;
  }

  idec->state_ = STATE_WEBP_HEADER;
  idec->chunk_size_ = 0;

  idec->last_mb_y_ = -1;

  InitMemBuffer(&idec->mem_);
  WebPInitDecBuffer(&idec->output_);
  VP8InitIo(&idec->io_);

  WebPResetDecParams(&idec->params_);
  if (output_buffer == NULL || WebPAvoidSlowMemory(output_buffer, features)) {
    idec->params_.output = &idec->output_;
    idec->final_output_ = output_buffer;
    if (output_buffer != NULL) {
      idec->params_.output->colorspace = output_buffer->colorspace;
    }
  } else {
    idec->params_.output = output_buffer;
    idec->final_output_ = NULL;
  }
  WebPInitCustomIo(&idec->params_, &idec->io_);  // Plug the I/O functions.

  return idec;
}